

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O3

void __thiscall deci_FlexLexer::ctor_common(deci_FlexLexer *this)

{
  this->yy_c_buf_p = (char *)0x0;
  this->yy_init = 0;
  this->yy_start = 0;
  this->yy_did_buffer_switch_on_eof = 0;
  (this->super_FlexLexer).yylineno = 1;
  (this->super_FlexLexer).yy_flex_debug = 0;
  *(undefined8 *)&(this->super_FlexLexer).field_0x1c = 0;
  this->yy_start_stack = (int *)0x0;
  this->yy_state_buf = (yy_state_type *)0x0;
  this->yy_buffer_stack_top = 0;
  this->yy_buffer_stack_max = 0;
  this->yy_buffer_stack = (yy_buffer_state **)0x0;
  this->yy_looking_for_trail_begin = 0;
  this->yy_more_flag = 0;
  this->yy_more_len = 0;
  this->yy_more_offset = 0;
  this->yy_prev_more_offset = 0;
  return;
}

Assistant:

void yyFlexLexer::ctor_common()
{
	yy_c_buf_p = 0;
	yy_init = 0;
	yy_start = 0;
	yy_flex_debug = 0;
	yylineno = 1;	// this will only get updated if %option yylineno

	yy_did_buffer_switch_on_eof = 0;

	yy_looking_for_trail_begin = 0;
	yy_more_flag = 0;
	yy_more_len = 0;
	yy_more_offset = yy_prev_more_offset = 0;

	yy_start_stack_ptr = yy_start_stack_depth = 0;
	yy_start_stack = NULL;

	yy_buffer_stack = NULL;
	yy_buffer_stack_top = 0;
	yy_buffer_stack_max = 0;

	yy_state_buf = 0;

}